

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

int __thiscall
gl4cts::ShadingLanguage420PackTests::init(ShadingLanguage420PackTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  BindingSamplerSingleTest *this_00;
  BindingImageSingleTest *this_01;
  TestNode *pTVar1;
  QualifierOrderTest *this_02;
  QualifierOrderBlockTest *this_03;
  ImplicitConversionsValidTest *this_04;
  QualifierOrderUniformTest *this_05;
  QualifierOrderFunctionInoutTest *this_06;
  QualifierOrderFunctionInputTest *this_07;
  QualifierOrderFunctionOutputTest *this_08;
  BindingUniformBlocksTest *this_09;
  BindingUniformSingleBlockTest *this_10;
  BindingUniformBlockArrayTest *this_11;
  BindingUniformAPIOverirdeTest *this_12;
  BindingSamplersTest *this_13;
  BindingSamplerArrayTest *this_14;
  BindingSamplerAPIOverrideTest *this_15;
  BindingImagesTest *this_16;
  BindingImageArrayTest *this_17;
  BindingImageAPIOverrideTest *this_18;
  InitializerListTest *this_19;
  InitializerListNegativeTest *this_20;
  LengthOfVectorAndMatrixTest *this_21;
  BuiltInValuesTest *this_22;
  
  this_00 = (BindingSamplerSingleTest *)operator_new(0xa0);
  GLSL420Pack::BindingSamplerSingleTest::BindingSamplerSingleTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (BindingImageSingleTest *)operator_new(0xa0);
  GLSL420Pack::BindingImageSingleTest::BindingImageSingleTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x88);
  GLSL420Pack::UTF8CharactersTest::UTF8CharactersTest
            ((UTF8CharactersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::UTF8InSourceTest::UTF8InSourceTest
            ((UTF8InSourceTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_02 = (QualifierOrderTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderTest::QualifierOrderTest(this_02,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (QualifierOrderBlockTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderBlockTest::QualifierOrderBlockTest
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pTVar1 = (TestNode *)operator_new(0x88);
  GLSL420Pack::LineContinuationTest::LineContinuationTest
            ((LineContinuationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::LineNumberingTest::LineNumberingTest
            ((LineNumberingTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_04 = (ImplicitConversionsValidTest *)operator_new(0xb0);
  GLSL420Pack::ImplicitConversionsValidTest::ImplicitConversionsValidTest
            (this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ImplicitConversionsInvalidTest::ImplicitConversionsInvalidTest
            ((ImplicitConversionsInvalidTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ConstDynamicValueTest::ConstDynamicValueTest
            ((ConstDynamicValueTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ConstAssignmentTest::ConstAssignmentTest
            ((ConstAssignmentTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ConstDynamicValueAsConstExprTest::ConstDynamicValueAsConstExprTest
            ((ConstDynamicValueAsConstExprTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_05 = (QualifierOrderUniformTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderUniformTest::QualifierOrderUniformTest
            (this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (QualifierOrderFunctionInoutTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderFunctionInoutTest::QualifierOrderFunctionInoutTest
            (this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (QualifierOrderFunctionInputTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderFunctionInputTest::QualifierOrderFunctionInputTest
            (this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (QualifierOrderFunctionOutputTest *)operator_new(0xa0);
  GLSL420Pack::QualifierOrderFunctionOutputTest::QualifierOrderFunctionOutputTest
            (this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::QualifierOverrideLayoutTest::QualifierOverrideLayoutTest
            ((QualifierOverrideLayoutTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_09 = (BindingUniformBlocksTest *)operator_new(200);
  GLSL420Pack::BindingUniformBlocksTest::BindingUniformBlocksTest
            (this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (BindingUniformSingleBlockTest *)operator_new(0xa0);
  GLSL420Pack::BindingUniformSingleBlockTest::BindingUniformSingleBlockTest
            (this_10,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  this_11 = (BindingUniformBlockArrayTest *)operator_new(0x1d0);
  GLSL420Pack::BindingUniformBlockArrayTest::BindingUniformBlockArrayTest
            (this_11,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingUniformDefaultTest::BindingUniformDefaultTest
            ((BindingUniformDefaultTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_12 = (BindingUniformAPIOverirdeTest *)operator_new(0x98);
  GLSL420Pack::BindingUniformAPIOverirdeTest::BindingUniformAPIOverirdeTest
            (this_12,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingUniformGlobalBlockTest::BindingUniformGlobalBlockTest
            ((BindingUniformGlobalBlockTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingUniformInvalidTest::BindingUniformInvalidTest
            ((BindingUniformInvalidTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_13 = (BindingSamplersTest *)operator_new(0xe8);
  GLSL420Pack::BindingSamplersTest::BindingSamplersTest
            (this_13,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  this_14 = (BindingSamplerArrayTest *)operator_new(0x128);
  GLSL420Pack::BindingSamplerArrayTest::BindingSamplerArrayTest
            (this_14,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingSamplerDefaultTest::BindingSamplerDefaultTest
            ((BindingSamplerDefaultTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_15 = (BindingSamplerAPIOverrideTest *)operator_new(0x98);
  GLSL420Pack::BindingSamplerAPIOverrideTest::BindingSamplerAPIOverrideTest
            (this_15,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingSamplerInvalidTest::BindingSamplerInvalidTest
            ((BindingSamplerInvalidTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_16 = (BindingImagesTest *)operator_new(0x118);
  GLSL420Pack::BindingImagesTest::BindingImagesTest(this_16,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
  this_17 = (BindingImageArrayTest *)operator_new(0x128);
  GLSL420Pack::BindingImageArrayTest::BindingImageArrayTest
            (this_17,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingImageDefaultTest::BindingImageDefaultTest
            ((BindingImageDefaultTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_18 = (BindingImageAPIOverrideTest *)operator_new(0x98);
  GLSL420Pack::BindingImageAPIOverrideTest::BindingImageAPIOverrideTest
            (this_18,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BindingImageInvalidTest::BindingImageInvalidTest
            ((BindingImageInvalidTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_19 = (InitializerListTest *)operator_new(0xa0);
  GLSL420Pack::InitializerListTest::InitializerListTest
            (this_19,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
  this_20 = (InitializerListNegativeTest *)operator_new(0xa0);
  GLSL420Pack::InitializerListNegativeTest::InitializerListNegativeTest
            (this_20,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_20);
  this_21 = (LengthOfVectorAndMatrixTest *)operator_new(0xa0);
  GLSL420Pack::LengthOfVectorAndMatrixTest::LengthOfVectorAndMatrixTest
            (this_21,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_21);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::LengthOfComputeResultTest::LengthOfComputeResultTest
            ((LengthOfComputeResultTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ScalarSwizzlersTest::ScalarSwizzlersTest
            ((ScalarSwizzlersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::ScalarSwizzlersInvalidTest::ScalarSwizzlersInvalidTest
            ((ScalarSwizzlersInvalidTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_22 = (BuiltInValuesTest *)operator_new(0x88);
  GLSL420Pack::BuiltInValuesTest::BuiltInValuesTest(this_22,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_22);
  pTVar1 = (TestNode *)operator_new(0x80);
  GLSL420Pack::BuiltInAssignmentTest::BuiltInAssignmentTest
            ((BuiltInAssignmentTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ShadingLanguage420PackTests::init(void)
{
	addChild(new GLSL420Pack::BindingSamplerSingleTest(m_context));
	addChild(new GLSL420Pack::BindingImageSingleTest(m_context));
	addChild(new GLSL420Pack::UTF8CharactersTest(m_context));
	addChild(new GLSL420Pack::UTF8InSourceTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderBlockTest(m_context));
	addChild(new GLSL420Pack::LineContinuationTest(m_context));
	addChild(new GLSL420Pack::LineNumberingTest(m_context));
	addChild(new GLSL420Pack::ImplicitConversionsValidTest(m_context));
	addChild(new GLSL420Pack::ImplicitConversionsInvalidTest(m_context));
	addChild(new GLSL420Pack::ConstDynamicValueTest(m_context));
	addChild(new GLSL420Pack::ConstAssignmentTest(m_context));
	addChild(new GLSL420Pack::ConstDynamicValueAsConstExprTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderUniformTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionInoutTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionInputTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionOutputTest(m_context));
	addChild(new GLSL420Pack::QualifierOverrideLayoutTest(m_context));
	addChild(new GLSL420Pack::BindingUniformBlocksTest(m_context));
	addChild(new GLSL420Pack::BindingUniformSingleBlockTest(m_context));
	addChild(new GLSL420Pack::BindingUniformBlockArrayTest(m_context));
	addChild(new GLSL420Pack::BindingUniformDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingUniformAPIOverirdeTest(m_context));
	addChild(new GLSL420Pack::BindingUniformGlobalBlockTest(m_context));
	addChild(new GLSL420Pack::BindingUniformInvalidTest(m_context));
	addChild(new GLSL420Pack::BindingSamplersTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerArrayTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerAPIOverrideTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerInvalidTest(m_context));
	addChild(new GLSL420Pack::BindingImagesTest(m_context));
	addChild(new GLSL420Pack::BindingImageArrayTest(m_context));
	addChild(new GLSL420Pack::BindingImageDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingImageAPIOverrideTest(m_context));
	addChild(new GLSL420Pack::BindingImageInvalidTest(m_context));
	addChild(new GLSL420Pack::InitializerListTest(m_context));
	addChild(new GLSL420Pack::InitializerListNegativeTest(m_context));
	addChild(new GLSL420Pack::LengthOfVectorAndMatrixTest(m_context));
	addChild(new GLSL420Pack::LengthOfComputeResultTest(m_context));
	addChild(new GLSL420Pack::ScalarSwizzlersTest(m_context));
	addChild(new GLSL420Pack::ScalarSwizzlersInvalidTest(m_context));
	addChild(new GLSL420Pack::BuiltInValuesTest(m_context));
	addChild(new GLSL420Pack::BuiltInAssignmentTest(m_context));
}